

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

bool __thiscall miniscript::Node<unsigned_int>::CheckStackSize(Node<unsigned_int> *this)

{
  long lVar1;
  bool bVar2;
  uint *puVar3;
  Node<unsigned_int> *in_RDI;
  long in_FS_OFFSET;
  optional<unsigned_int> ss;
  optional<unsigned_int> exec_ss;
  MiniscriptContext in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Node<unsigned_int> *this_00;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = IsTapscript(in_stack_ffffffffffffffc8);
  if (bVar2) {
    GetExecStackSize(this_00);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar2) {
      local_19 = std::enable_if<is_convertible<decltype(((std::
                 declval<unsigned_int_const&>)())<=((std::declval<int_const&>)())),bool>::
                 value,bool>::type_std::operator<=((optional<unsigned_int> *)this_00,(int *)in_RDI);
    }
    else {
      local_19 = true;
    }
  }
  else {
    GetStackSize(this_00);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar2) {
      puVar3 = std::optional<unsigned_int>::operator*
                         ((optional<unsigned_int> *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_19 = *puVar3 < 0x65;
    }
    else {
      local_19 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckStackSize() const {
        // Since in Tapscript there is no standardness limit on the script and witness sizes, we may run
        // into the maximum stack size while executing the script. Make sure it doesn't happen.
        if (IsTapscript(m_script_ctx)) {
            if (const auto exec_ss = GetExecStackSize()) return exec_ss <= MAX_STACK_SIZE;
            return true;
        }
        if (const auto ss = GetStackSize()) return *ss <= MAX_STANDARD_P2WSH_STACK_ITEMS;
        return true;
    }